

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical gai_check_ghost_distr(Integer g_a)

{
  long lVar1;
  Integer ipx;
  Integer np;
  Integer ndim;
  Integer idx;
  Integer handle;
  Integer g_a_local;
  
  lVar1 = g_a + 1000;
  ipx = 0;
  idx = 0;
  do {
    if (GA[lVar1].ndim <= idx) {
      return 1;
    }
    for (np = 0; np < GA[lVar1].nblock[idx]; np = np + 1) {
      if (np < GA[lVar1].nblock[idx] + -1) {
        if ((GA[lVar1].mapc[ipx + 1] - GA[lVar1].mapc[ipx]) + 1 < GA[lVar1].width[idx]) {
          return 0;
        }
      }
      else if ((GA[lVar1].dims[idx] - GA[lVar1].mapc[ipx]) + 1 < GA[lVar1].width[idx]) {
        return 0;
      }
      ipx = ipx + 1;
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

static logical gai_check_ghost_distr(Integer g_a)
{
  Integer handle=GA_OFFSET + g_a;
  Integer idx, ndim, np, ipx;
  ndim = GA[handle].ndim;
  ipx = 0;
  for (idx = 0; idx < ndim; idx++) {
    for (np = 0; np < GA[handle].nblock[idx]; np++) {
      if (np < GA[handle].nblock[idx] - 1) {
        if (GA[handle].mapc[ipx+1]-GA[handle].mapc[ipx]+1
            <GA[handle].width[idx]) {
          return FALSE;
        }
      } else {
        if (GA[handle].dims[idx]-GA[handle].mapc[ipx]+1
            <GA[handle].width[idx]) {
          return FALSE;
        }
      }
      ipx++;
    }
  }
  return TRUE;
}